

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O0

void BindReference(ParseNode *pnode,ByteCodeGenerator *byteCodeGenerator)

{
  code *pcVar1;
  bool bVar2;
  SymbolType SVar3;
  uint32 uVar4;
  ParseNodeCall *pPVar5;
  ParseNodeUni *pPVar6;
  ParseNodeBin *pPVar7;
  undefined4 *puVar8;
  ParseNodeName *this;
  Symbol **symRef;
  Symbol *pSVar9;
  Scope *scope;
  ParseNodeName *pnodeName;
  bool funcEscapes;
  bool isCallNode;
  ByteCodeGenerator *byteCodeGenerator_local;
  ParseNode *pnode_local;
  
  pnodeName._7_1_ = false;
  bVar2 = false;
  switch(pnode->nop) {
  case knopTypeof:
  case knopDelete:
    pPVar6 = ParseNode::AsParseNodeUni(pnode);
    byteCodeGenerator_local = (ByteCodeGenerator *)pPVar6->pnode1;
    break;
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                       ,0x8de,"(0)","Unexpected opcode in BindReference");
    if (bVar2) {
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
      return;
    }
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  case knopCall:
    pnodeName._7_1_ = true;
    pPVar5 = ParseNode::AsParseNodeCall(pnode);
    byteCodeGenerator_local = (ByteCodeGenerator *)pPVar5->pnodeTarget;
    break;
  case knopDot:
  case knopIndex:
    bVar2 = true;
  case knopAsg:
    pPVar7 = ParseNode::AsParseNodeBin(pnode);
    byteCodeGenerator_local = (ByteCodeGenerator *)pPVar7->pnode1;
  }
  if (*(char *)&byteCodeGenerator_local->scriptContext == '\x01') {
    this = ParseNode::AsParseNodeName((ParseNode *)byteCodeGenerator_local);
    symRef = ParseNodeName::GetSymRef(this);
    pSVar9 = ByteCodeGenerator::FindSymbol(byteCodeGenerator,symRef,this->pid,pnodeName._7_1_);
    this->sym = pSVar9;
    if ((((bVar2) && (this->sym != (Symbol *)0x0)) &&
        (SVar3 = Symbol::GetSymbolType(this->sym), SVar3 == STFunction)) &&
       ((bVar2 = Symbol::GetIsGlobal(this->sym), !bVar2 ||
        (uVar4 = ByteCodeGenerator::GetFlags(byteCodeGenerator), (uVar4 & 0x400) != 0)))) {
      scope = Symbol::GetScope(this->sym);
      ByteCodeGenerator::FuncEscapes(byteCodeGenerator,scope);
    }
  }
  return;
}

Assistant:

void BindReference(ParseNode *pnode, ByteCodeGenerator *byteCodeGenerator)
{
    // Do special reference-op binding so that we can, for instance, handle call from inside "with"
    // where the "this" instance must be found dynamically.

    bool isCallNode = false;
    bool funcEscapes = false;
    switch (pnode->nop)
    {
    case knopCall:
        isCallNode = true;
        pnode = pnode->AsParseNodeCall()->pnodeTarget;
        break;
    case knopDelete:
    case knopTypeof:
        pnode = pnode->AsParseNodeUni()->pnode1;
        break;
    case knopDot:
    case knopIndex:
        funcEscapes = true;
        // fall through
    case knopAsg:
        pnode = pnode->AsParseNodeBin()->pnode1;
        break;
    default:
        AssertMsg(0, "Unexpected opcode in BindReference");
        return;
    }

    if (pnode->nop == knopName)
    {
        ParseNodeName * pnodeName = pnode->AsParseNodeName();
        pnodeName->sym = byteCodeGenerator->FindSymbol(pnodeName->GetSymRef(), pnodeName->pid, isCallNode);

        if (funcEscapes &&
            pnodeName->sym &&
            pnodeName->sym->GetSymbolType() == STFunction &&
            (!pnodeName->sym->GetIsGlobal() || (byteCodeGenerator->GetFlags() & fscrEval)))
        {
            // Dot, index, and scope ops can cause a local function on the LHS to escape.
            // Make sure scopes are not cached in this case.
            byteCodeGenerator->FuncEscapes(pnodeName->sym->GetScope());
        }
    }
}